

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.cpp
# Opt level: O0

unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true> __thiscall
duckdb::PhysicalPlanGenerator::Plan
          (PhysicalPlanGenerator *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  PhysicalOperator *pPVar1;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_> in_RDI;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_00000018;
  PhysicalPlanGenerator *in_stack_00000020;
  PhysicalOperator *plan;
  _Head_base<0UL,_duckdb::PhysicalPlan_*,_false> this_00;
  
  this_00._M_head_impl =
       (PhysicalPlan *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::PhysicalPlan_*,_std::default_delete<duckdb::PhysicalPlan>_>.
       super__Head_base<0UL,_duckdb::PhysicalPlan_*,_false>._M_head_impl;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_RDI._M_t.
                super___uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::PhysicalPlan_*,_std::default_delete<duckdb::PhysicalPlan>_>
                .super__Head_base<0UL,_duckdb::PhysicalPlan_*,_false>._M_head_impl,in_RDX);
  pPVar1 = ResolveAndPlan(in_stack_00000020,in_stack_00000018);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)0x7a0ad4);
  (*pPVar1->_vptr_PhysicalOperator[7])();
  unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::unique_ptr
            ((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true> *)
             this_00._M_head_impl,
             (unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true> *)
             in_RDX);
  return (unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>)
         (__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::PhysicalPlan_*,_std::default_delete<duckdb::PhysicalPlan>_>.
         super__Head_base<0UL,_duckdb::PhysicalPlan_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<PhysicalPlan> PhysicalPlanGenerator::Plan(unique_ptr<LogicalOperator> op) {
	auto &plan = ResolveAndPlan(std::move(op));
	plan.Verify();
	return std::move(physical_plan);
}